

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesglobaltypes.cpp
# Opt level: O0

void __thiscall
GlobalStimulationSettings::GlobalStimulationSettings(GlobalStimulationSettings *this)

{
  NetworkDataType *in_RDI;
  
  NetworkDataType::NetworkDataType(in_RDI);
  in_RDI->_vptr_NetworkDataType = (_func_int **)&PTR__GlobalStimulationSettings_005d66b8;
  *(undefined1 *)((long)&in_RDI[1]._vptr_NetworkDataType + 4) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_NetworkDataType + 5) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_NetworkDataType + 6) = 1;
  *(undefined1 *)((long)&in_RDI[1]._vptr_NetworkDataType + 7) = 1;
  *(undefined1 *)&in_RDI[2]._vptr_NetworkDataType = 0;
  *(undefined4 *)&in_RDI[1]._vptr_NetworkDataType = 6;
  return;
}

Assistant:

GlobalStimulationSettings::GlobalStimulationSettings() {
    //Global mode settings
    settle_All_Channels_If_One_Channel_Is_Settling = false;
    settle_Same_Chip_If_One_Channel_Is_Settling = false;
    use_Fast_Settle_For_Amp_Settle_Mode = true; //false makes it use amplifier low frequency cutoff instead
    use_Switch_For_Charge_Recovery = true; //false makes it use current-limited drivers instead
    use_DC_amp = false;  //for 10 bit DC amplifiers. False makes it use 16 bit AC amplifiers
    scaleValue = max1uA;

}